

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

bool absl::lts_20250127::container_internal::operator==(iterator *a,iterator *b)

{
  slot_type *psVar1;
  slot_type *psVar2;
  slot_type *psVar3;
  ctrl_t *pcVar4;
  slot_type *psVar5;
  uint64_t uVar6;
  slot_type *psVar7;
  ulong uVar8;
  iterator iVar9;
  
  psVar1 = (slot_type *)a->ctrl_;
  if ((psVar1 == (slot_type *)(kEmptyGroup + 0x10) || psVar1 == (slot_type *)0x0) ||
     (-1 < *(char *)psVar1)) {
    psVar2 = (slot_type *)b->ctrl_;
    if ((psVar2 == (slot_type *)(kEmptyGroup + 0x10) || psVar2 == (slot_type *)0x0) ||
       (-1 < *(char *)psVar2)) {
      if (psVar1 == (slot_type *)(kEmptyGroup + 0x10) && psVar2 == (slot_type *)(kEmptyGroup + 0x10)
         ) {
LAB_003ceb1f:
        return psVar1 == psVar2;
      }
      if ((psVar1 == (slot_type *)(kEmptyGroup + 0x10)) !=
          (psVar2 == (slot_type *)(kEmptyGroup + 0x10))) goto LAB_003ceb3b;
      if (psVar1 == (slot_type *)0x0 || psVar2 == (slot_type *)0x0) goto LAB_003ceb1f;
      if ((psVar2 == (slot_type *)kSooControl) == (psVar1 == (slot_type *)kSooControl)) {
        a = (iterator *)(a->field_1).slot_;
        psVar3 = (b->field_1).slot_;
        if (psVar1 == (slot_type *)kSooControl) {
          if ((slot_type *)a == psVar3) goto LAB_003ceb1f;
        }
        else {
          psVar7 = psVar3;
          psVar5 = psVar2;
          b = (iterator *)(slot_type *)a;
          if (psVar2 < psVar1) {
            psVar7 = (slot_type *)a;
            psVar5 = psVar1;
            b = (iterator *)psVar3;
          }
          if ((psVar5 < b) && (b <= psVar7)) goto LAB_003ceb1f;
        }
      }
      operator==();
      goto LAB_003ceb31;
    }
  }
  else {
LAB_003ceb31:
    operator==();
  }
  operator==();
LAB_003ceb3b:
  operator==();
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,int>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,int>>>
  ::AssertHashEqConsistent<std::vector<int,std::allocator<int>>>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,int>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,int>>>
              *)a,(vector<int,_std::allocator<int>_> *)b);
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_int>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_int>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
              *)a);
  pcVar4 = (ctrl_t *)
           (((value_type *)b)->first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = hash_internal::MixingHashState::CombineContiguousImpl
                    (&hash_internal::MixingHashState::kSeed,pcVar4,
                     (long)((anon_union_8_1_a8a14541_for_iterator_2 *)
                           &(((value_type *)b)->first).super__Vector_base<int,_std::allocator<int>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->slot_ - (long)pcVar4);
  uVar8 = ((long)((anon_union_8_1_a8a14541_for_iterator_2 *)
                 &(((value_type *)b)->first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish)->slot_ -
           (long)(((value_type *)b)->first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2 ^ uVar6) * -0x234dd359734ecb13;
  iVar9 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,int>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,int>>>
          ::find_non_soo<std::vector<int,std::allocator<int>>>
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,int>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,int>>>
                      *)a,(key_arg<std::vector<int>_> *)b,
                     uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                     (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                     (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                     (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38);
  return iVar9.ctrl_._0_1_;
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }